

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-det.cpp
# Opt level: O0

int main(void)

{
  allocator<long_long> *paVar1;
  allocator<std::vector<long_long,_std::allocator<long_long>_>_> *paVar2;
  initializer_list<long_long> __l;
  initializer_list<long_long> __l_00;
  initializer_list<std::vector<long_long,_std::allocator<long_long>_>_> __l_01;
  initializer_list<long_long> __l_02;
  initializer_list<long_long> __l_03;
  initializer_list<std::vector<long_long,_std::allocator<long_long>_>_> __l_04;
  initializer_list<long_long> __l_05;
  initializer_list<long_long> __l_06;
  initializer_list<long_long> __l_07;
  initializer_list<std::vector<long_long,_std::allocator<long_long>_>_> __l_08;
  size_type __n;
  reference this;
  size_type __n_00;
  T TVar3;
  vector<long_long,_std::allocator<long_long>_> *local_388;
  vector<long_long,_std::allocator<long_long>_> *local_348;
  vector<long_long,_std::allocator<long_long>_> *local_308;
  allocator<std::vector<long_long,_std::allocator<long_long>_>_> local_2c2;
  allocator<long_long> local_2c1;
  vector<long_long,_std::allocator<long_long>_> local_2c0;
  undefined1 local_2a8 [8];
  Matrix out;
  longlong local_288 [2];
  iterator local_278;
  size_type local_270;
  allocator<long_long> local_261;
  longlong local_260 [2];
  iterator local_250;
  size_type local_248;
  vector<long_long,_std::allocator<long_long>_> *local_240;
  vector<long_long,_std::allocator<long_long>_> local_238;
  vector<long_long,_std::allocator<long_long>_> local_220;
  undefined1 local_208 [24];
  Matrix c;
  longlong local_1d8 [2];
  iterator local_1c8;
  size_type local_1c0;
  allocator<long_long> local_1b1;
  longlong local_1b0 [2];
  iterator local_1a0;
  size_type local_198;
  vector<long_long,_std::allocator<long_long>_> *local_190;
  vector<long_long,_std::allocator<long_long>_> local_188;
  vector<long_long,_std::allocator<long_long>_> local_170;
  undefined1 local_158 [24];
  Matrix b;
  longlong local_128 [3];
  iterator local_110;
  size_type local_108;
  allocator<long_long> local_f9;
  longlong local_f8 [3];
  iterator local_e0;
  size_type local_d8;
  allocator<long_long> local_b9;
  longlong local_b8 [4];
  iterator local_98;
  size_type local_90;
  vector<long_long,_std::allocator<long_long>_> *local_88;
  vector<long_long,_std::allocator<long_long>_> local_80;
  vector<long_long,_std::allocator<long_long>_> local_68;
  vector<long_long,_std::allocator<long_long>_> local_50;
  undefined1 local_38 [24];
  Matrix a;
  
  a.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  b.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_b8[0] = 1;
  local_b8[1] = 2;
  local_b8[2] = 3;
  local_98 = local_b8;
  local_90 = 3;
  local_88 = &local_80;
  std::allocator<long_long>::allocator(&local_b9);
  __l_07._M_len = local_90;
  __l_07._M_array = local_98;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_80,__l_07,&local_b9);
  local_f8[0] = 4;
  local_f8[1] = 5;
  local_f8[2] = 6;
  local_e0 = local_f8;
  local_d8 = 3;
  local_88 = &local_68;
  std::allocator<long_long>::allocator(&local_f9);
  __l_06._M_len = local_d8;
  __l_06._M_array = local_e0;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_68,__l_06,&local_f9);
  local_128[0] = 7;
  local_128[1] = 8;
  local_128[2] = 9;
  local_110 = local_128;
  local_108 = 3;
  paVar1 = (allocator<long_long> *)
           ((long)&b.
                   super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_88 = &local_50;
  std::allocator<long_long>::allocator(paVar1);
  __l_05._M_len = local_108;
  __l_05._M_array = local_110;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_50,__l_05,paVar1);
  b.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_38._0_8_ = &local_80;
  local_38._8_8_ = (pointer)0x3;
  paVar2 = (allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)
           ((long)&b.
                   super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::allocator(paVar2);
  __l_08._M_len = local_38._8_8_;
  __l_08._M_array = (iterator)local_38._0_8_;
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            *)(local_38 + 0x10),__l_08,paVar2);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::~allocator
            ((allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)
             ((long)&b.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_308 = (vector<long_long,_std::allocator<long_long>_> *)local_38;
  do {
    local_308 = local_308 + -1;
    std::vector<long_long,_std::allocator<long_long>_>::~vector(local_308);
  } while (local_308 != &local_80);
  std::allocator<long_long>::~allocator
            ((allocator<long_long> *)
             ((long)&b.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<long_long>::~allocator(&local_f9);
  std::allocator<long_long>::~allocator(&local_b9);
  c.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_1b0[0] = 7;
  local_1b0[1] = 8;
  local_1a0 = local_1b0;
  local_198 = 2;
  local_190 = &local_188;
  std::allocator<long_long>::allocator(&local_1b1);
  __l_03._M_len = local_198;
  __l_03._M_array = local_1a0;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_188,__l_03,&local_1b1);
  local_1d8[0] = 9;
  local_1d8[1] = 10;
  local_1c8 = local_1d8;
  local_1c0 = 2;
  paVar1 = (allocator<long_long> *)
           ((long)&c.
                   super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_190 = &local_170;
  std::allocator<long_long>::allocator(paVar1);
  __l_02._M_len = local_1c0;
  __l_02._M_array = local_1c8;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_170,__l_02,paVar1);
  c.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_158._0_8_ = &local_188;
  local_158._8_8_ = (pointer)0x2;
  paVar2 = (allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)
           ((long)&c.
                   super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::allocator(paVar2);
  __l_04._M_len = local_158._8_8_;
  __l_04._M_array = (iterator)local_158._0_8_;
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            *)(local_158 + 0x10),__l_04,paVar2);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::~allocator
            ((allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)
             ((long)&c.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_348 = (vector<long_long,_std::allocator<long_long>_> *)local_158;
  do {
    local_348 = local_348 + -1;
    std::vector<long_long,_std::allocator<long_long>_>::~vector(local_348);
  } while (local_348 != &local_188);
  std::allocator<long_long>::~allocator
            ((allocator<long_long> *)
             ((long)&c.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<long_long>::~allocator(&local_1b1);
  out.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_260[0] = 0x3a;
  local_260[1] = 0x40;
  local_250 = local_260;
  local_248 = 2;
  local_240 = &local_238;
  std::allocator<long_long>::allocator(&local_261);
  __l_00._M_len = local_248;
  __l_00._M_array = local_250;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_238,__l_00,&local_261);
  local_288[0] = 0x8b;
  local_288[1] = 0x9a;
  local_278 = local_288;
  local_270 = 2;
  paVar1 = (allocator<long_long> *)
           ((long)&out.
                   super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_240 = &local_220;
  std::allocator<long_long>::allocator(paVar1);
  __l._M_len = local_270;
  __l._M_array = local_278;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_220,__l,paVar1);
  out.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_208._0_8_ = &local_238;
  local_208._8_8_ = (pointer)0x2;
  paVar2 = (allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)
           ((long)&out.
                   super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::allocator(paVar2);
  __l_01._M_len = local_208._8_8_;
  __l_01._M_array = (iterator)local_208._0_8_;
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            *)(local_208 + 0x10),__l_01,paVar2);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::~allocator
            ((allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)
             ((long)&out.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_388 = (vector<long_long,_std::allocator<long_long>_> *)local_208;
  do {
    local_388 = local_388 + -1;
    std::vector<long_long,_std::allocator<long_long>_>::~vector(local_388);
  } while (local_388 != &local_238);
  std::allocator<long_long>::~allocator
            ((allocator<long_long> *)
             ((long)&out.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<long_long>::~allocator(&local_261);
  __n = std::
        vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
        ::size((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                *)(local_38 + 0x10));
  this = std::
         vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
         ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                       *)(local_38 + 0x10),0);
  __n_00 = std::vector<long_long,_std::allocator<long_long>_>::size(this);
  std::allocator<long_long>::allocator(&local_2c1);
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_2c0,__n_00,&local_2c1);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::allocator(&local_2c2);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            *)local_2a8,__n,&local_2c0,&local_2c2);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::~allocator(&local_2c2);
  std::vector<long_long,_std::allocator<long_long>_>::~vector(&local_2c0);
  std::allocator<long_long>::~allocator(&local_2c1);
  TVar3 = det((Matrix *)(local_38 + 0x10));
  if (TVar3 != 0) {
    __assert_fail("det(a) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/drathier[P]compprogcheatsheet/code/math/matrix-det.cpp"
                  ,0x29,"int main()");
  }
  TVar3 = det((Matrix *)(local_158 + 0x10));
  if (TVar3 != -2) {
    __assert_fail("det(b) == -2",
                  "/workspace/llm4binary/github/license_c_cmakelists/drathier[P]compprogcheatsheet/code/math/matrix-det.cpp"
                  ,0x2a,"int main()");
  }
  TVar3 = det((Matrix *)(local_208 + 0x10));
  if (TVar3 == 0x24) {
    a.
    super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::
    vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
    ::~vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
               *)local_2a8);
    std::
    vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
    ::~vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
               *)(local_208 + 0x10));
    std::
    vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
    ::~vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
               *)(local_158 + 0x10));
    std::
    vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
    ::~vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
               *)(local_38 + 0x10));
    return a.
           super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  __assert_fail("det(c) == 36",
                "/workspace/llm4binary/github/license_c_cmakelists/drathier[P]compprogcheatsheet/code/math/matrix-det.cpp"
                ,0x2b,"int main()");
}

Assistant:

int main() {
	Matrix a({{1, 2, 3},
						 {4, 5, 6},
						 {7, 8, 9}});
	Matrix b({{7, 8},
						 {9, 10}});
	Matrix c({{58,  64},
						 {139, 154}});
	Matrix out(a.size(), Row(a[0].size()));

	assert(det(a) == 0);
	assert(det(b) == -2);
	assert(det(c) == 36);

	return 0;
}